

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall testing::internal::RE::~RE(RE *this)

{
  string *in_RDI;
  
  if (((byte)in_RDI[0x20] & 1) != 0) {
    regfree((regex_t *)(in_RDI + 0x68));
    regfree((regex_t *)(in_RDI + 0x28));
  }
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

RE::~RE() {
  if (is_valid_) {
    // regfree'ing an invalid regex might crash because the content
    // of the regex is undefined. Since the regex's are essentially
    // the same, one cannot be valid (or invalid) without the other
    // being so too.
    regfree(&partial_regex_);
    regfree(&full_regex_);
  }
}